

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

double __thiscall units::detail::unit_data::pow(unit_data *this,double __x,double __y)

{
  unit_data uVar1;
  unit_data uVar2;
  unit_data uVar3;
  int iVar4;
  int in_ESI;
  double extraout_XMM0_Qa;
  uint local_8c;
  uint local_88;
  uint local_80;
  int power_local;
  unit_data *this_local;
  
  uVar1 = *this;
  uVar2 = *this;
  uVar3 = *this;
  iVar4 = rootHertzModifier(this,in_ESI);
  if (in_ESI % 2 == 0) {
    local_80 = 0;
  }
  else {
    local_80 = (uint)*this >> 0x1d & 1;
  }
  if (in_ESI % 2 == 0) {
    if ((((uint)*this >> 0x1d & 1) == 0) || (((uint)*this >> 0x1e & 1) == 0)) {
      local_88 = (uint)*this >> 0x1e & 1;
    }
    else {
      local_88 = 0;
    }
    local_8c = local_88;
  }
  else {
    local_8c = (uint)*this >> 0x1e & 1;
  }
  unit_data((unit_data *)((long)&this_local + 4),(((int)uVar1 << 0x1c) >> 0x1c) * in_ESI,
            (((int)uVar2 << 0x15) >> 0x1d) * in_ESI,(((int)uVar3 << 0x18) >> 0x1c) * in_ESI + iVar4,
            (((int)*this << 0x12) >> 0x1d) * in_ESI,(((int)*this << 0xd) >> 0x1d) * in_ESI,
            (((int)*this << 0xb) >> 0x1e) * in_ESI,(((int)*this << 0x10) >> 0x1e) * in_ESI,
            (((int)*this << 6) >> 0x1e) * in_ESI,(((int)*this << 4) >> 0x1e) * in_ESI,
            (((int)*this << 8) >> 0x1d) * in_ESI,(uint)*this >> 0x1c & 1,local_80,local_8c,
            (uint)*this >> 0x1f);
  return extraout_XMM0_Qa;
}

Assistant:

constexpr unit_data pow(int power) const
        {  // the modifier is to handle a few weird operations that operate on
           // square_root Hz,
            return {
                meter_ * power,
                kilogram_ * power,
                (second_ * power) + rootHertzModifier(power),
                ampere_ * power,
                kelvin_ * power,
                mole_ * power,
                candela_ * power,
                currency_ * power,
                count_ * power,
                radians_ * power,
                per_unit_,
                (power % 2 == 0) ? 0U : i_flag_,
                (power % 2 == 0) ? ((i_flag_ && e_flag_) ? 0U : e_flag_) :
                                   e_flag_,
                equation_};
        }